

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  error_code *in_RSI;
  error_code *in_RDI;
  json_source_adaptor<jsoncons::stream_source<char>_> *unaff_retaddr;
  span<const_char,_18446744073709551615UL> s;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffffd0;
  span<const_char,_18446744073709551615UL> in_stack_ffffffffffffffe0;
  error_code *ec_00;
  
  ec_00 = in_RDI;
  bVar1 = json_source_adaptor<jsoncons::stream_source<char>_>::is_error
                    ((json_source_adaptor<jsoncons::stream_source<char>_> *)0x49165d);
  if (bVar1) {
    std::error_code::operator=
              ((error_code *)in_stack_ffffffffffffffe0.data_,(json_errc)((ulong)in_RDI >> 0x20));
  }
  else {
    bVar1 = json_source_adaptor<jsoncons::stream_source<char>_>::eof
                      ((json_source_adaptor<jsoncons::stream_source<char>_> *)0x491681);
    if (bVar1) {
      basic_json_parser<char,_std::allocator<char>_>::check_done
                ((basic_json_parser<char,_std::allocator<char>_> *)in_stack_ffffffffffffffe0.data_,
                 in_RDI);
      std::error_code::operator_cast_to_bool(in_RSI);
    }
    else {
      do {
        bVar1 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                          ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x1b));
        if (bVar1) {
          in_stack_ffffffffffffffe0 =
               json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(unaff_retaddr,ec_00)
          ;
          bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
          if (bVar1) {
            return;
          }
          sVar2 = detail::span<const_char,_18446744073709551615UL>::size
                            ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffe0);
          if (sVar2 != 0) {
            this_00 = (basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x1b);
            in_stack_ffffffffffffffd0 =
                 (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *)
                 detail::span<const_char,_18446744073709551615UL>::data
                           ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffe0);
            sVar2 = detail::span<const_char,_18446744073709551615UL>::size
                              ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffe0)
            ;
            basic_json_parser<char,_std::allocator<char>_>::update
                      (this_00,(char_type *)in_stack_ffffffffffffffd0,sVar2);
          }
        }
        bVar1 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                          ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x1b));
        if (!bVar1) {
          basic_json_parser<char,_std::allocator<char>_>::check_done
                    ((basic_json_parser<char,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffe0.data_,in_RDI);
          bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
          if (bVar1) {
            return;
          }
        }
        bVar1 = eof(in_stack_ffffffffffffffd0);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  return;
}

Assistant:

void check_done(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }   
            if (source_.eof())
            {
                parser_.check_done(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
            else
            {
                do
                {
                    if (parser_.source_exhausted())
                    {
                        auto s = source_.read_buffer(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                        if (s.size() > 0)
                        {
                            parser_.update(s.data(),s.size());
                        }
                    }
                    if (!parser_.source_exhausted())
                    {
                        parser_.check_done(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                    }
                }
                while (!eof());
            }
        }